

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O1

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  
  if (tcp != (uv_stream_t *)0x0) {
    if (nread < 0) {
      if (nread != -0xfff) goto LAB_001729af;
      puts("GOT EOF");
      uv_close((uv_handle_t *)tcp,close_cb);
    }
    else {
      bytes_received_done = bytes_received_done + nread;
    }
    free(buf->base);
    return;
  }
  read_cb_cold_2();
LAB_001729af:
  read_cb_cold_1();
  if (tcp != (uv_stream_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)tcp);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)tcp,(uv_close_cb)0x0);
  return;
}

Assistant:

static void read_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  /* The server will not send anything, it should close gracefully. */

  if (buf->base) {
    free(buf->base);
  }

  if (nread >= 0) {
    ASSERT(nread == 0);
  } else {
    ASSERT(tcp != NULL);
    ASSERT(nread == UV_EOF);
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}